

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void print_term_escaped(Term *t,int double_escaped)

{
  char *pcVar1;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_40;
  char *local_38;
  char *local_30;
  char *quote;
  char *s;
  int double_escaped_local;
  Term *t_local;
  
  quote = (char *)0x0;
  if (t->term_name == (char *)0x0) {
    if (t->kind == TERM_STRING) {
      if (t->string == (char *)0x0) {
        local_30 = (char *)0x0;
      }
      else {
        local_30 = escape_string_single_quote(t->string);
      }
      quote = local_30;
      if ((t->string == (char *)0x0) || (*t->string == '\0')) {
        printf("<EOF> ");
      }
      else {
        if (double_escaped == 0) {
          local_38 = local_30;
        }
        else {
          local_38 = escape_string_single_quote(local_30);
        }
        printf("\'%s\' ",local_38);
        if (((byte)t->field_0x2c >> 3 & 1) != 0) {
          printf("/i ");
        }
        if (t->term_priority != 0) {
          pcVar1 = "$";
          if (double_escaped != 0) {
            pcVar1 = "#";
          }
          printf("%sterm %d ",pcVar1,(ulong)(uint)t->term_priority);
        }
      }
    }
    else if (t->kind == TERM_REGEX) {
      pcVar1 = "\"";
      if (double_escaped != 0) {
        pcVar1 = "\\\"";
      }
      if (t->string == (char *)0x0) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = escape_string(t->string);
      }
      quote = local_40;
      if (double_escaped == 0) {
        local_50 = local_40;
      }
      else {
        local_50 = escape_string(local_40);
      }
      printf("%s%s%s ",pcVar1,local_50,pcVar1);
      if (((byte)t->field_0x2c >> 3 & 1) != 0) {
        printf("/i ");
      }
      if (t->term_priority != 0) {
        pcVar1 = "$";
        if (double_escaped != 0) {
          pcVar1 = "#";
        }
        printf("%sterm %d ",pcVar1,(ulong)(uint)t->term_priority);
      }
    }
    else if (t->kind == TERM_CODE) {
      if (t->string == (char *)0x0) {
        local_58 = (char *)0x0;
      }
      else {
        local_58 = escape_string(t->string);
      }
      quote = local_58;
      printf("code(\"%s\") ",local_58);
    }
    else if (t->kind == TERM_TOKEN) {
      if (t->string == (char *)0x0) {
        local_60 = (char *)0x0;
      }
      else {
        local_60 = escape_string(t->string);
      }
      quote = local_60;
      printf("%s ",local_60);
    }
    else {
      d_fail("unknown token kind");
    }
  }
  else {
    printf("%s ",t->term_name);
  }
  if (quote != (char *)0x0) {
    free(quote);
  }
  return;
}

Assistant:

static void print_term_escaped(Term *t, int double_escaped) {
  char *s = 0;
  if (t->term_name) {
    printf("%s ", t->term_name);
  } else if (t->kind == TERM_STRING) {
    s = t->string ? escape_string_single_quote(t->string) : NULL;
    if (!t->string || !*t->string)
      printf("<EOF> ");
    else {
      printf("'%s' ", double_escaped ? escape_string_single_quote(s) : s);
      if (t->ignore_case) printf("/i ");
      if (t->term_priority) printf("%sterm %d ", double_escaped ? "#" : "$", t->term_priority);
    }
  } else if (t->kind == TERM_REGEX) {
    char *quote = double_escaped ? "\\\"" : "\"";
    s = t->string ? escape_string(t->string) : NULL;
    /* char *s = t->string; // ? escape_string(t->string) : NULL; */
    printf("%s%s%s ", quote, double_escaped ? escape_string(s) : s, quote);
    if (t->ignore_case) printf("/i ");
    if (t->term_priority) printf("%sterm %d ", double_escaped ? "#" : "$", t->term_priority);
  } else if (t->kind == TERM_CODE) {
    s = t->string ? escape_string(t->string) : NULL;
    printf("code(\"%s\") ", s);
  } else if (t->kind == TERM_TOKEN) {
    s = t->string ? escape_string(t->string) : NULL;
    printf("%s ", s);
  } else
    d_fail("unknown token kind");
  if (s) FREE(s);
}